

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int handle_connection(int sockfd,ptls_context_t *ctx,char *server_name,char *input_file,
                     ptls_handshake_properties_t *hsprop,int request_key_update)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  ptls_t *tls_00;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  ulong local_42b0;
  size_t max_can_be_sent;
  size_t send_amount;
  size_t leftlen;
  size_t off;
  fd_set *__arr_2;
  __fd_mask *p_Stack_4280;
  uint __i_2;
  fd_set *__arr_1;
  __fd_mask *p_Stack_4270;
  uint __i_1;
  fd_set *__arr;
  undefined1 auStack_4260 [4];
  uint __i;
  timeval timeout;
  undefined1 local_4248 [4];
  int maxfd;
  fd_set exceptfds;
  fd_set writefds;
  fd_set readfds;
  ssize_t ioret;
  size_t early_bytes_sent;
  int local_40b0;
  int ret;
  int inputfd;
  anon_enum_32 state;
  char bytebuf [16384];
  undefined1 local_a0 [8];
  ptls_buffer_t ptbuf;
  ptls_buffer_t encbuf;
  ptls_buffer_t rbuf;
  ptls_t *tls;
  int request_key_update_local;
  ptls_handshake_properties_t *hsprop_local;
  char *input_file_local;
  char *server_name_local;
  ptls_context_t *ctx_local;
  int sockfd_local;
  
  tls_00 = ptls_new(ctx,(uint)(server_name == (char *)0x0));
  ret = 0;
  local_40b0 = 0;
  early_bytes_sent._4_4_ = 0;
  ioret = 0;
  ptls_buffer_init((ptls_buffer_t *)&encbuf.is_allocated,"",0);
  ptls_buffer_init((ptls_buffer_t *)&ptbuf.is_allocated,"",0);
  ptls_buffer_init((ptls_buffer_t *)local_a0,"",0);
  fcntl(sockfd,4,0x800);
  if ((input_file != (char *)0x0) &&
     (local_40b0 = open(input_file,0), __stream = _stderr, local_40b0 == -1)) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(__stream,"failed to open file:%s:%s\n",input_file,pcVar4);
    early_bytes_sent._4_4_ = 1;
LAB_00107bda:
    if (sockfd != -1) {
      close(sockfd);
    }
    if ((input_file != (char *)0x0) && (local_40b0 != -1)) {
      close(local_40b0);
    }
    ptls_buffer_dispose((ptls_buffer_t *)&encbuf.is_allocated);
    ptls_buffer_dispose((ptls_buffer_t *)&ptbuf.is_allocated);
    ptls_buffer_dispose((ptls_buffer_t *)local_a0);
    ptls_free(tls_00);
    return (int)(early_bytes_sent._4_4_ != 0);
  }
  if (server_name != (char *)0x0) {
    ptls_set_server_name(tls_00,server_name,0);
    uVar1 = ptls_handshake(tls_00,(ptls_buffer_t *)&ptbuf.is_allocated,(void *)0x0,(size_t *)0x0,
                           hsprop);
    if (uVar1 != 0x202) {
      fprintf(_stderr,"ptls_handshake:%d\n",(ulong)uVar1);
      early_bytes_sent._4_4_ = 1;
      goto LAB_00107bda;
    }
    early_bytes_sent._4_4_ = 0x202;
  }
  do {
    do {
      p_Stack_4270 = writefds.fds_bits + 0xf;
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        p_Stack_4270[__arr._4_4_] = 0;
      }
      p_Stack_4280 = exceptfds.fds_bits + 0xf;
      for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
        p_Stack_4280[__arr_1._4_4_] = 0;
      }
      off = (size_t)local_4248;
      for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
        *(undefined8 *)(off + (ulong)__arr_2._4_4_ * 8) = 0;
      }
      writefds.fds_bits[(long)(sockfd / 0x40) + 0xf] =
           1L << ((byte)((long)sockfd % 0x40) & 0x3f) |
           writefds.fds_bits[(long)(sockfd / 0x40) + 0xf];
      if (encbuf.capacity != 0) {
        exceptfds.fds_bits[(long)(sockfd / 0x40) + 0xf] =
             1L << ((byte)((long)sockfd % 0x40) & 0x3f) |
             exceptfds.fds_bits[(long)(sockfd / 0x40) + 0xf];
      }
      *(ulong *)(local_4248 + (long)(sockfd / 0x40) * 8) =
           1L << ((byte)((long)sockfd % 0x40) & 0x3f) |
           *(ulong *)(local_4248 + (long)(sockfd / 0x40) * 8);
      timeout.tv_usec._4_4_ = sockfd + 1;
      if (local_40b0 != -1) {
        writefds.fds_bits[(long)(local_40b0 / 0x40) + 0xf] =
             1L << ((byte)((long)local_40b0 % 0x40) & 0x3f) |
             writefds.fds_bits[(long)(local_40b0 / 0x40) + 0xf];
        *(ulong *)(local_4248 + (long)(local_40b0 / 0x40) * 8) =
             1L << ((byte)((long)local_40b0 % 0x40) & 0x3f) |
             *(ulong *)(local_4248 + (long)(local_40b0 / 0x40) * 8);
        if (timeout.tv_usec._4_4_ <= local_40b0) {
          timeout.tv_usec._4_4_ = local_40b0 + 1;
        }
      }
      iVar2 = 0xe10;
      if (encbuf.capacity != 0) {
        iVar2 = 0;
      }
      _auStack_4260 = (long)iVar2;
      timeout.tv_sec = 0;
      iVar2 = select(timeout.tv_usec._4_4_,(fd_set *)(writefds.fds_bits + 0xf),
                     (fd_set *)(exceptfds.fds_bits + 0xf),(fd_set *)local_4248,
                     (timeval *)auStack_4260);
    } while (iVar2 == -1);
    if (((writefds.fds_bits[(long)(sockfd / 0x40) + 0xf] &
         1L << ((byte)((long)sockfd % 0x40) & 0x3f)) != 0) ||
       ((*(ulong *)(local_4248 + (long)(sockfd / 0x40) * 8) &
        1L << ((byte)((long)sockfd % 0x40) & 0x3f)) != 0)) {
      leftlen = 0;
      do {
        readfds.fds_bits[0xf] = read(sockfd,&inputfd,0x4000);
        bVar6 = false;
        if (readfds.fds_bits[0xf] == -1) {
          piVar3 = __errno_location();
          bVar6 = *piVar3 == 4;
        }
      } while (bVar6);
      if ((readfds.fds_bits[0xf] == -1) &&
         ((piVar3 = __errno_location(), *piVar3 == 0xb ||
          (piVar3 = __errno_location(), *piVar3 == 0xb)))) {
        readfds.fds_bits[0xf] = 0;
      }
      else if (readfds.fds_bits[0xf] < 1) goto LAB_00107bda;
      for (; send_amount = readfds.fds_bits[0xf] - leftlen, send_amount != 0;
          leftlen = send_amount + leftlen) {
        if (ret == 0) {
          early_bytes_sent._4_4_ =
               ptls_handshake(tls_00,(ptls_buffer_t *)&ptbuf.is_allocated,
                              (void *)((long)&inputfd + leftlen),&send_amount,hsprop);
          if (early_bytes_sent._4_4_ == 0) {
            ret = 1;
            iVar2 = ptls_is_server(tls_00);
            if ((iVar2 == 0) &&
               ((hsprop->field_0).client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN
               )) {
              __assert_fail("ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/cli.c"
                            ,0x8a,
                            "int handle_connection(int, ptls_context_t *, const char *, const char *, ptls_handshake_properties_t *, int)"
                           );
            }
            if ((hsprop->field_0).client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED) {
              shift_buffer((ptls_buffer_t *)local_a0,ioret);
            }
            if (request_key_update != 0) {
              ptls_update_key(tls_00,1);
            }
            if (ptbuf.capacity != 0) {
              early_bytes_sent._4_4_ =
                   ptls_send(tls_00,(ptls_buffer_t *)&ptbuf.is_allocated,(void *)local_a0,
                             ptbuf.capacity);
              if (early_bytes_sent._4_4_ != 0) {
                fprintf(_stderr,"ptls_send(1rtt):%d\n",(ulong)early_bytes_sent._4_4_);
                goto LAB_00107bda;
              }
              ptbuf.capacity = 0;
            }
          }
          else if (early_bytes_sent._4_4_ != 0x202) {
            if (encbuf.capacity != 0) {
              write(sockfd,(void *)ptbuf._24_8_,encbuf.capacity);
            }
            fprintf(_stderr,"ptls_handshake:%d\n",(ulong)early_bytes_sent._4_4_);
            goto LAB_00107bda;
          }
        }
        else {
          early_bytes_sent._4_4_ =
               ptls_receive(tls_00,(ptls_buffer_t *)&encbuf.is_allocated,
                            (void *)((long)&inputfd + leftlen),&send_amount);
          if (early_bytes_sent._4_4_ == 0) {
            if (rbuf.capacity != 0) {
              write(1,(void *)encbuf._24_8_,rbuf.capacity);
              rbuf.capacity = 0;
            }
          }
          else if (early_bytes_sent._4_4_ != 0x202) {
            fprintf(_stderr,"ptls_receive:%d\n",(ulong)early_bytes_sent._4_4_);
            goto LAB_00107bda;
          }
        }
      }
    }
    if ((local_40b0 != -1) &&
       (((writefds.fds_bits[(long)(local_40b0 / 0x40) + 0xf] &
         1L << ((byte)((long)local_40b0 % 0x40) & 0x3f)) != 0 ||
        ((*(ulong *)(local_4248 + (long)(local_40b0 / 0x40) * 8) &
         1L << ((byte)((long)local_40b0 % 0x40) & 0x3f)) != 0)))) {
      do {
        sVar5 = read(local_40b0,&inputfd,0x4000);
        bVar6 = false;
        if (sVar5 == 0xffffffffffffffff) {
          piVar3 = __errno_location();
          bVar6 = *piVar3 == 4;
        }
      } while (bVar6);
      if ((long)sVar5 < 1) {
        if (input_file != (char *)0x0) {
          close(local_40b0);
        }
        local_40b0 = -1;
      }
      else {
        early_bytes_sent._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)local_a0,&inputfd,sVar5);
        if (early_bytes_sent._4_4_ != 0) goto LAB_00107bda;
        if (ret == 0) {
          max_can_be_sent = 0;
          if ((server_name != (char *)0x0) &&
             ((hsprop->field_0).client.max_early_data_size != (size_t *)0x0)) {
            local_42b0 = *(hsprop->field_0).client.max_early_data_size;
            if (ptbuf.capacity < local_42b0) {
              local_42b0 = ptbuf.capacity;
            }
            max_can_be_sent = local_42b0 - ioret;
          }
          if (max_can_be_sent != 0) {
            early_bytes_sent._4_4_ =
                 ptls_send(tls_00,(ptls_buffer_t *)&ptbuf.is_allocated,(void *)local_a0,
                           max_can_be_sent);
            if (early_bytes_sent._4_4_ != 0) {
              fprintf(_stderr,"ptls_send(early_data):%d\n",(ulong)early_bytes_sent._4_4_);
              goto LAB_00107bda;
            }
            ioret = max_can_be_sent + ioret;
          }
        }
        else {
          early_bytes_sent._4_4_ =
               ptls_send(tls_00,(ptls_buffer_t *)&ptbuf.is_allocated,&inputfd,sVar5);
          if (early_bytes_sent._4_4_ != 0) {
            fprintf(_stderr,"ptls_send(1rtt):%d\n",(ulong)early_bytes_sent._4_4_);
            goto LAB_00107bda;
          }
          ptbuf.capacity = 0;
        }
      }
    }
    if (encbuf.capacity != 0) {
      do {
        sVar5 = write(sockfd,(void *)ptbuf._24_8_,encbuf.capacity);
        bVar6 = false;
        if (sVar5 == 0xffffffffffffffff) {
          piVar3 = __errno_location();
          bVar6 = *piVar3 == 4;
        }
      } while (bVar6);
      if ((sVar5 != 0xffffffffffffffff) ||
         ((piVar3 = __errno_location(), *piVar3 != 0xb &&
          (piVar3 = __errno_location(), *piVar3 != 0xb)))) {
        if ((long)sVar5 < 1) goto LAB_00107bda;
        shift_buffer((ptls_buffer_t *)&ptbuf.is_allocated,sVar5);
      }
    }
    if ((ret == 1) && (local_40b0 == -1)) {
      shutdown(sockfd,1);
      ret = 2;
    }
  } while( true );
}

Assistant:

static int handle_connection(int sockfd, ptls_context_t *ctx, const char *server_name, const char *input_file,
                             ptls_handshake_properties_t *hsprop, int request_key_update)
{
    ptls_t *tls = ptls_new(ctx, server_name == NULL);
    ptls_buffer_t rbuf, encbuf, ptbuf;
    char bytebuf[16384];
    enum { IN_HANDSHAKE, IN_1RTT, IN_SHUTDOWN } state = IN_HANDSHAKE;
    int inputfd = 0, ret = 0;
    size_t early_bytes_sent = 0;
    ssize_t ioret;

    ptls_buffer_init(&rbuf, "", 0);
    ptls_buffer_init(&encbuf, "", 0);
    ptls_buffer_init(&ptbuf, "", 0);

    fcntl(sockfd, F_SETFL, O_NONBLOCK);

    if (input_file != NULL) {
        if ((inputfd = open(input_file, O_RDONLY)) == -1) {
            fprintf(stderr, "failed to open file:%s:%s\n", input_file, strerror(errno));
            ret = 1;
            goto Exit;
        }
    }
    if (server_name != NULL) {
        ptls_set_server_name(tls, server_name, 0);
        if ((ret = ptls_handshake(tls, &encbuf, NULL, NULL, hsprop)) != PTLS_ERROR_IN_PROGRESS) {
            fprintf(stderr, "ptls_handshake:%d\n", ret);
            ret = 1;
            goto Exit;
        }
    }

    while (1) {
        /* check if data is available */
        fd_set readfds, writefds, exceptfds;
        int maxfd = 0;
        struct timeval timeout;
        do {
            FD_ZERO(&readfds);
            FD_ZERO(&writefds);
            FD_ZERO(&exceptfds);
            FD_SET(sockfd, &readfds);
            if (encbuf.off != 0)
                FD_SET(sockfd, &writefds);
            FD_SET(sockfd, &exceptfds);
            maxfd = sockfd + 1;
            if (inputfd != -1) {
                FD_SET(inputfd, &readfds);
                FD_SET(inputfd, &exceptfds);
                if (maxfd <= inputfd)
                    maxfd = inputfd + 1;
            }
            timeout.tv_sec = encbuf.off != 0 ? 0 : 3600;
            timeout.tv_usec = 0;
        } while (select(maxfd, &readfds, &writefds, &exceptfds, &timeout) == -1);

        /* consume incoming messages */
        if (FD_ISSET(sockfd, &readfds) || FD_ISSET(sockfd, &exceptfds)) {
            size_t off = 0, leftlen;
            while ((ioret = read(sockfd, bytebuf, sizeof(bytebuf))) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
                ioret = 0;
            } else if (ioret <= 0) {
                goto Exit;
            }
            while ((leftlen = ioret - off) != 0) {
                if (state == IN_HANDSHAKE) {
                    if ((ret = ptls_handshake(tls, &encbuf, bytebuf + off, &leftlen, hsprop)) == 0) {
                        state = IN_1RTT;
                        assert(ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
                        /* release data sent as early-data, if server accepted it */
                        if (hsprop->client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED)
                            shift_buffer(&ptbuf, early_bytes_sent);
                        if (request_key_update)
                            ptls_update_key(tls, 1);
                        if (ptbuf.off != 0) {
                            if ((ret = ptls_send(tls, &encbuf, ptbuf.base, ptbuf.off)) != 0) {
                                fprintf(stderr, "ptls_send(1rtt):%d\n", ret);
                                goto Exit;
                            }
                            ptbuf.off = 0;
                        }
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        if (encbuf.off != 0)
                            (void)write(sockfd, encbuf.base, encbuf.off);
                        fprintf(stderr, "ptls_handshake:%d\n", ret);
                        goto Exit;
                    }
                } else {
                    if ((ret = ptls_receive(tls, &rbuf, bytebuf + off, &leftlen)) == 0) {
                        if (rbuf.off != 0) {
                            write(1, rbuf.base, rbuf.off);
                            rbuf.off = 0;
                        }
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        fprintf(stderr, "ptls_receive:%d\n", ret);
                        goto Exit;
                    }
                }
                off += leftlen;
            }
        }

        /* read input (and send if possible) */
        if (inputfd != -1 && (FD_ISSET(inputfd, &readfds) || FD_ISSET(inputfd, &exceptfds))) {
            while ((ioret = read(inputfd, bytebuf, sizeof(bytebuf))) == -1 && errno == EINTR)
                ;
            if (ioret > 0) {
                ptls_buffer_pushv(&ptbuf, bytebuf, ioret);
                if (state == IN_HANDSHAKE) {
                    size_t send_amount = 0;
                    if (server_name != NULL && hsprop->client.max_early_data_size != NULL) {
                        size_t max_can_be_sent = *hsprop->client.max_early_data_size;
                        if (max_can_be_sent > ptbuf.off)
                            max_can_be_sent = ptbuf.off;
                        send_amount = max_can_be_sent - early_bytes_sent;
                    }
                    if (send_amount != 0) {
                        if ((ret = ptls_send(tls, &encbuf, ptbuf.base, send_amount)) != 0) {
                            fprintf(stderr, "ptls_send(early_data):%d\n", ret);
                            goto Exit;
                        }
                        early_bytes_sent += send_amount;
                    }
                } else {
                    if ((ret = ptls_send(tls, &encbuf, bytebuf, ioret)) != 0) {
                        fprintf(stderr, "ptls_send(1rtt):%d\n", ret);
                        goto Exit;
                    }
                    ptbuf.off = 0;
                }
            } else {
                /* closed */
                if (input_file != NULL)
                    close(inputfd);
                inputfd = -1;
            }
        }

        /* send any data */
        if (encbuf.off != 0) {
            while ((ioret = write(sockfd, encbuf.base, encbuf.off)) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
            } else if (ioret <= 0) {
                goto Exit;
            } else {
                shift_buffer(&encbuf, ioret);
            }
        }

        /* close the sender side when necessary */
        if (state == IN_1RTT && inputfd == -1) {
            /* FIXME send close_alert */
            shutdown(sockfd, SHUT_WR);
            state = IN_SHUTDOWN;
        }
    }

Exit:
    if (sockfd != -1)
        close(sockfd);
    if (input_file != NULL && inputfd != -1)
        close(inputfd);
    ptls_buffer_dispose(&rbuf);
    ptls_buffer_dispose(&encbuf);
    ptls_buffer_dispose(&ptbuf);
    ptls_free(tls);
    return ret != 0;
}